

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_int.hpp
# Opt level: O3

size_t ans_int_compress(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  uint8_t *puVar9;
  ulong uVar10;
  ans_int_encode ans_frame;
  ulong local_b8 [4];
  uint8_t *local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  uint8_t *local_78;
  ans_int_encode local_70;
  
  ans_int_encode::create(&local_70,src,srcSize);
  local_78 = dst;
  ans_serialize_interp(&local_70.nfreqs,local_70.frame_size,&local_78);
  local_b8[1] = local_70.lower_bound;
  local_b8[2] = local_70.lower_bound;
  local_b8[3] = local_70.lower_bound;
  local_b8[0] = local_70.lower_bound;
  puVar9 = local_78;
  if ((srcSize & 3) == 0) {
    sVar7 = 0;
  }
  else {
    sVar7 = (size_t)((uint)srcSize & 3);
    lVar8 = 0;
    do {
      uVar1 = src[srcSize + lVar8 + -1];
      if (local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1].sym_upper_bound <= local_b8[0]) {
        *(int *)puVar9 = (int)local_b8[0];
        puVar9 = puVar9 + 4;
        local_b8[0] = local_b8[0] >> 0x20;
      }
      lVar8 = lVar8 + -1;
      uVar2 = local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].freq;
      local_b8[0] = (ulong)local_70.table.
                           super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar1].base +
                    local_b8[0] % (ulong)uVar2 + (local_b8[0] / uVar2) * local_70.frame_size;
    } while (-lVar8 != sVar7);
  }
  if (sVar7 != srcSize) {
    uVar10 = srcSize & 0xfffffffffffffffc;
    local_90 = local_70.frame_size;
    do {
      uVar1 = src[uVar10 - 1];
      if (local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1].sym_upper_bound <= local_b8[0]) {
        *(int *)puVar9 = (int)local_b8[0];
        puVar9 = puVar9 + 4;
        local_b8[0] = local_b8[0] >> 0x20;
      }
      uVar2 = local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].freq;
      local_80 = (ulong)local_70.table.
                        super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1].base;
      uVar1 = src[uVar10 - 2];
      if (local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1].sym_upper_bound <= local_b8[1]) {
        *(int *)puVar9 = (int)local_b8[1];
        puVar9 = puVar9 + 4;
        local_b8[1] = local_b8[1] >> 0x20;
      }
      uVar3 = local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].freq;
      local_88 = (ulong)local_70.table.
                        super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1].base;
      uVar1 = src[uVar10 - 3];
      if (local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1].sym_upper_bound <= local_b8[2]) {
        *(int *)puVar9 = (int)local_b8[2];
        puVar9 = puVar9 + 4;
        local_b8[2] = local_b8[2] >> 0x20;
      }
      uVar4 = local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].freq;
      uVar1 = local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].base;
      uVar5 = src[uVar10 - 4];
      if (local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5].sym_upper_bound <= local_b8[3]) {
        *(int *)puVar9 = (int)local_b8[3];
        puVar9 = puVar9 + 4;
        local_b8[3] = local_b8[3] >> 0x20;
      }
      uVar6 = local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar5].freq;
      local_b8[0] = local_b8[0] % (ulong)uVar2 + local_80 +
                    (local_b8[0] / uVar2) * local_70.frame_size;
      local_b8[1] = local_b8[1] % (ulong)uVar3 + local_88 +
                    (local_b8[1] / uVar3) * local_70.frame_size;
      local_b8[2] = local_b8[2] % (ulong)uVar4 + (ulong)uVar1 +
                    (local_b8[2] / uVar4) * local_70.frame_size;
      local_b8[3] = (ulong)local_70.table.
                           super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar5].base +
                    local_b8[3] % (ulong)uVar6 + (local_b8[3] / uVar6) * local_70.frame_size;
      uVar10 = uVar10 - 4;
    } while (uVar10 != 0);
    local_98 = dst;
  }
  lVar8 = 0;
  do {
    *(uint64_t *)(puVar9 + lVar8) = *(long *)((long)local_b8 + lVar8) - local_70.lower_bound;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x20);
  if (local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.table.super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.table.
                          super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.table.
                          super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (size_t)(puVar9 + (0x20 - (long)dst));
}

Assistant:

size_t ans_int_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    const uint32_t num_states = 4;
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_int_encode::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    std::array<uint64_t, num_states> states;

    // start encoding
    for (uint32_t i = 0; i < num_states; i++)
        states[i] = ans_frame.initial_state();

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = out_u8 - reinterpret_cast<uint8_t*>(dst);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    // std::cout << "encoding" << std::endl;
    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % num_states != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += num_states;
    }

    // flush final state
    for (uint32_t i = 0; i < num_states; i++)
        ans_frame.flush_state(states[i], out_u8);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes = (out_u8 - reinterpret_cast<uint8_t*>(dst))
        - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}